

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode DiagnosticInfo_decodeBinary(UA_DiagnosticInfo *dst,UA_DataType *_)

{
  byte bVar1;
  uint uVar2;
  UA_StatusCode UVar3;
  UA_DiagnosticInfo *pUVar4;
  UA_Byte *pUVar5;
  uint uVar6;
  uint uVar7;
  
  pUVar5 = pos + 1;
  UVar3 = 0x80070000;
  if (pUVar5 <= end) {
    uVar6 = 0;
    do {
      bVar1 = *pos;
      uVar7 = 0;
      pos = pUVar5;
      if ((bVar1 & 1) != 0) {
        *(byte *)dst = *(byte *)dst | 1;
        uVar7 = 0x80070000;
        if (pos + 4 <= end) {
          dst->symbolicId = *(UA_Int32 *)pos;
          pos = pos + 4;
          uVar7 = 0;
        }
      }
      if ((bVar1 & 2) != 0) {
        *(byte *)dst = *(byte *)dst | 2;
        uVar2 = 0x80070000;
        if (pos + 4 <= end) {
          dst->namespaceUri = *(UA_Int32 *)pos;
          uVar2 = 0;
          pos = pos + 4;
        }
        uVar7 = uVar7 | uVar2;
      }
      if ((bVar1 & 4) != 0) {
        *(byte *)dst = *(byte *)dst | 4;
        uVar2 = 0x80070000;
        if (pos + 4 <= end) {
          dst->localizedText = *(UA_Int32 *)pos;
          uVar2 = 0;
          pos = pos + 4;
        }
        uVar7 = uVar7 | uVar2;
      }
      if ((bVar1 & 8) != 0) {
        *(byte *)dst = *(byte *)dst | 8;
        uVar2 = 0x80070000;
        if (pos + 4 <= end) {
          dst->locale = *(UA_Int32 *)pos;
          uVar2 = 0;
          pos = pos + 4;
        }
        uVar7 = uVar7 | uVar2;
      }
      if ((bVar1 & 0x10) != 0) {
        *(byte *)dst = *(byte *)dst | 0x10;
        UVar3 = Array_decodeBinary(&(dst->additionalInfo).data,&(dst->additionalInfo).length,
                                   UA_TYPES + 2);
        uVar7 = uVar7 | UVar3;
      }
      if ((bVar1 & 0x20) != 0) {
        *(byte *)dst = *(byte *)dst | 0x20;
        uVar2 = 0x80070000;
        if (pos + 4 <= end) {
          dst->innerStatusCode = *(UA_StatusCode *)pos;
          uVar2 = 0;
          pos = pos + 4;
        }
        uVar7 = uVar7 | uVar2;
      }
      if ((bVar1 & 0x40) == 0) goto LAB_00113413;
      pUVar4 = (UA_DiagnosticInfo *)calloc(1,0x38);
      dst->innerDiagnosticInfo = pUVar4;
      if (pUVar4 == (UA_DiagnosticInfo *)0x0) {
        uVar7 = 0x80030000;
        goto LAB_00113413;
      }
      *(byte *)dst = *(byte *)dst | 0x40;
      uVar6 = uVar6 | uVar7;
      pUVar5 = pos + 1;
      dst = pUVar4;
    } while (pUVar5 <= end);
    uVar7 = 0x80070000;
LAB_00113413:
    UVar3 = uVar6 | uVar7;
  }
  return UVar3;
}

Assistant:

static UA_StatusCode
DiagnosticInfo_decodeBinary(UA_DiagnosticInfo *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encodingMask;
    UA_StatusCode retval = Byte_decodeBinary(&encodingMask, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Decode the content */
    if(encodingMask & 0x01) {
        dst->hasSymbolicId = true;
        retval |= Int32_decodeBinary(&dst->symbolicId);
    }
    if(encodingMask & 0x02) {
        dst->hasNamespaceUri = true;
        retval |= Int32_decodeBinary(&dst->namespaceUri);
    }
    if(encodingMask & 0x04) {
        dst->hasLocalizedText = true;
        retval |= Int32_decodeBinary(&dst->localizedText);
    }
    if(encodingMask & 0x08) {
        dst->hasLocale = true;
        retval |= Int32_decodeBinary(&dst->locale);
    }
    if(encodingMask & 0x10) {
        dst->hasAdditionalInfo = true;
        retval |= String_decodeBinary(&dst->additionalInfo, NULL);
    }
    if(encodingMask & 0x20) {
        dst->hasInnerStatusCode = true;
        retval |= StatusCode_decodeBinary(&dst->innerStatusCode);
    }
    if(encodingMask & 0x40) {
        /* innerDiagnosticInfo is allocated on the heap */
        dst->innerDiagnosticInfo = (UA_DiagnosticInfo*)UA_calloc(1, sizeof(UA_DiagnosticInfo));
        if(!dst->innerDiagnosticInfo)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        dst->hasInnerDiagnosticInfo = true;
        retval |= DiagnosticInfo_decodeBinary(dst->innerDiagnosticInfo, NULL);
    }
    return retval;
}